

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::ShaderAtomicOpCase::~ShaderAtomicOpCase(ShaderAtomicOpCase *this)

{
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderAtomicOpCase_01e52db0;
  deinit(this);
  std::__cxx11::string::~string((string *)&this->m_funcName);
  tcu::TestCase::~TestCase((TestCase *)this);
  return;
}

Assistant:

ShaderAtomicOpCase::~ShaderAtomicOpCase (void)
{
	ShaderAtomicOpCase::deinit();
}